

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RunContext * __thiscall Catch::RunContext::getCurrentTestName_abi_cxx11_(RunContext *this)

{
  TestCaseInfo *pTVar1;
  long in_RSI;
  allocator local_19 [9];
  RunContext *this_local;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x38) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    pTVar1 = TestCase::getTestCaseInfo(*(TestCase **)(in_RSI + 0x38));
    std::__cxx11::string::string((string *)this,(string *)pTVar1);
  }
  return this;
}

Assistant:

virtual std::string getCurrentTestName() const {
            return m_activeTestCase
                ? m_activeTestCase->getTestCaseInfo().name
                : "";
        }